

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::discard_mips(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < (this->m_faces).m_size; uVar3 = uVar3 + 1) {
    pvVar1 = (this->m_faces).m_p;
    uVar2 = 1;
    if (1 < pvVar1[uVar3].m_size) {
      for (; uVar2 < pvVar1[uVar3].m_size; uVar2 = uVar2 + 1) {
        crnlib_delete<crnlib::mip_level>(pvVar1[uVar3].m_p[uVar2]);
        pvVar1 = (this->m_faces).m_p;
      }
      vector<crnlib::mip_level_*>::resize(pvVar1 + uVar3,1,false);
    }
  }
  return;
}

Assistant:

void mipmapped_texture::discard_mips() {
  for (uint f = 0; f < m_faces.size(); f++) {
    if (m_faces[f].size() > 1) {
      for (uint l = 1; l < m_faces[f].size(); l++)
        crnlib_delete(m_faces[f][l]);

      m_faces[f].resize(1);
    }
  }

  CRNLIB_ASSERT(check());
}